

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O1

void __thiscall djb::abc::abc(abc *this,char *name)

{
  double dVar1;
  int iVar2;
  exc *this_00;
  undefined8 *puVar3;
  void *__src;
  long *plVar4;
  impl *piVar5;
  long lVar6;
  undefined **local_40;
  long local_38;
  void *local_30;
  
  (this->super_brdf_rgb).super_brdf._vptr_brdf = (_func_int **)&PTR_eval_00206570;
  (this->m_fresnel).m_f = (impl *)0x0;
  this->m_data = (data *)0x0;
  lVar6 = 0;
  do {
    iVar2 = strcmp(*(char **)((long)&s_data + lVar6),name);
    if (iVar2 == 0) {
      this->m_data = (data *)((long)&s_data + lVar6);
      dVar1 = *(double *)((long)&DAT_00204668 + lVar6);
      puVar3 = (undefined8 *)operator_new(0xc);
      *(undefined4 *)(puVar3 + 1) = 0;
      *puVar3 = 0;
      __src = operator_new(0xc);
      lVar6 = 0;
      do {
        *(float *)((long)__src + lVar6) = (float)dVar1;
        lVar6 = lVar6 + 4;
      } while (lVar6 != 0xc);
      operator_delete(puVar3);
      local_40 = &PTR_clone_00206700;
      local_38 = 3;
      local_30 = operator_new(0xc);
      memcpy(local_30,__src,local_38 << 2);
      plVar4 = (long *)(*(code *)*local_40)(&local_40);
      piVar5 = (this->m_fresnel).m_f;
      if (piVar5 != (impl *)0x0) {
        (*piVar5->_vptr_impl[2])();
      }
      piVar5 = (impl *)(**(code **)*plVar4)(plVar4);
      (this->m_fresnel).m_f = piVar5;
      (**(code **)(*plVar4 + 0x10))(plVar4);
      local_40 = &PTR_clone_00206700;
      operator_delete(local_30);
      operator_delete(__src);
      return;
    }
    lVar6 = lVar6 + 0x50;
  } while (lVar6 != 8000);
  this_00 = (exc *)__cxa_allocate_exception(0x28);
  exc::exc(this_00,"djb_error: No ABC parameters for %s\n",name);
  __cxa_throw(this_00,&exc::typeinfo,exc::~exc);
}

Assistant:

abc::abc(const char *name): m_fresnel(), m_data(NULL)
{
	bool found = false;

	for (int i = 0; i < (int)(sizeof(abc::s_data) / sizeof(abc::data)); ++i) {
		if (!strcmp(s_data[i].name, name)) {
			m_data = &s_data[i];
			brdf::value_type ior(m_data->ior, zero_value().size());
			m_fresnel = fresnel::ptr(fresnel::unpolarized(ior));
			found = true;
			break;
		}
	}
	if (!found) throw exc("djb_error: No ABC parameters for %s\n", name);
}